

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartResumePdu.cpp
# Opt level: O2

bool __thiscall DIS::StartResumePdu::operator==(StartResumePdu *this,StartResumePdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = SimulationManagementFamilyPdu::operator==
                    (&this->super_SimulationManagementFamilyPdu,
                     &rhs->super_SimulationManagementFamilyPdu);
  bVar2 = ClockTime::operator==(&this->_realWorldTime,&rhs->_realWorldTime);
  bVar3 = ClockTime::operator==(&this->_simulationTime,&rhs->_simulationTime);
  return (bVar3 && (bVar2 && bVar1)) && this->_requestID == rhs->_requestID;
}

Assistant:

bool StartResumePdu::operator ==(const StartResumePdu& rhs) const
{
    bool ivarsEqual = true;

    ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

    if (!(_realWorldTime == rhs._realWorldTime))
        ivarsEqual = false;
    if (!(_simulationTime == rhs._simulationTime))
        ivarsEqual = false;
    if (!(_requestID == rhs._requestID))
        ivarsEqual = false;

    return ivarsEqual;
}